

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::HandleBadFullItem
          (cmComputeLinkInformation *this,LinkEntry *entry,string *file)

{
  cmake *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  pointer this_00;
  cmState *pcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  PolicyID id_00;
  undefined1 local_538 [16];
  string local_528;
  string local_508;
  undefined1 local_4e8 [8];
  ostringstream e;
  undefined1 local_370 [16];
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  ostringstream w;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  undefined1 local_148 [8];
  string wid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e8;
  undefined1 local_b8 [8];
  LinkEntry fileEntry;
  const_iterator local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  i;
  string *item;
  string *file_local;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry;
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Depends);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->Depends);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_38,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_40,i._M_current);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->Depends);
  bVar2 = __gnu_cxx::operator!=(&local_30,&local_48);
  if (bVar2) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_50,&local_30);
    fileEntry.Feature.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::erase(&this->Depends,local_50);
  }
  cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)local_b8,entry);
  std::__cxx11::string::string((string *)&local_108,(string *)file);
  wid.field_2._8_8_ = 0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)((long)&wid.field_2 + 8));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_e8,&local_108,(cmListFileBacktrace *)((long)&wid.field_2 + 8));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_b8,&local_e8);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_e8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&wid.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_108);
  AddUserItem(this,(LinkEntry *)local_b8,false);
  this_00 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
            operator->(&this->OrderLinkerSearchPath);
  cmOrderDirectories::AddLinkLibrary(this_00,i._M_current);
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  switch(PVar3) {
  case WARN:
    cmAlphaNum::cmAlphaNum(&local_178,"CMP0008-WARNING-GIVEN-");
    cmAlphaNum::cmAlphaNum(&local_1a8,i._M_current);
    cmStrCat<>((string *)local_148,&local_178,&local_1a8);
    pcVar4 = cmake::GetState(this->CMakeInstance);
    bVar2 = cmState::GetGlobalPropertyAsBool(pcVar4,(string *)local_148);
    if (!bVar2) {
      pcVar4 = cmake::GetState(this->CMakeInstance);
      cmState::SetGlobalProperty(pcVar4,(string *)local_148,"1");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x8,id);
      poVar5 = std::operator<<((ostream *)local_320,(string *)&local_340);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"Target \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\" links to item\n");
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,(string *)i._M_current);
      poVar5 = std::operator<<(poVar5,"\n");
      std::operator<<(poVar5,"which is a full-path but not a valid library file name.");
      std::__cxx11::string::~string((string *)&local_340);
      pcVar1 = this->CMakeInstance;
      std::__cxx11::ostringstream::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_370);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)(local_370 + 0x10),
                          (cmListFileBacktrace *)local_370);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_370);
      std::__cxx11::string::~string((string *)(local_370 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    }
    std::__cxx11::string::~string((string *)local_148);
  case OLD:
    break;
  case NEW:
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_508,(cmPolicies *)0x8,id_00);
    poVar5 = std::operator<<((ostream *)local_4e8,(string *)&local_508);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"Target \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5,"\" links to item\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)i._M_current);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"which is a full-path but not a valid library file name.");
    std::__cxx11::string::~string((string *)&local_508);
    pcVar1 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_538);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_538 + 0x10),
                        (cmListFileBacktrace *)local_538);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_538);
    std::__cxx11::string::~string((string *)(local_538 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
  }
  cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_b8);
  return;
}

Assistant:

void cmComputeLinkInformation::HandleBadFullItem(LinkEntry const& entry,
                                                 std::string const& file)
{
  std::string const& item = entry.Item.Value;
  // Do not depend on things that do not exist.
  auto i = std::find(this->Depends.begin(), this->Depends.end(), item);
  if (i != this->Depends.end()) {
    this->Depends.erase(i);
  }

  // Tell the linker to search for the item and provide the proper
  // path for it.  Do not contribute to any CMP0003 warning (do not
  // put in OldLinkDirItems or OldUserFlagItems).
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  // Produce any needed message.
  switch (this->Target->GetPolicyStatusCMP0008()) {
    case cmPolicies::WARN: {
      // Print the warning at most once for this item.
      std::string wid = cmStrCat("CMP0008-WARNING-GIVEN-", item);
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(wid)) {
        this->CMakeInstance->GetState()->SetGlobalProperty(wid, "1");
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0008) << "\n"
          << "Target \"" << this->Target->GetName() << "\" links to item\n"
          << "  " << item << "\n"
          << "which is a full-path but not a valid library file name.";
        /* clang-format on */
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: // NOLINT(bugprone-branch-clone)
      // OLD behavior does not warn.
      break;
    case cmPolicies::NEW:
      // NEW behavior will not get here.
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0008) << "\n"
          << "Target \"" << this->Target->GetName() << "\" links to item\n"
          << "  " << item << "\n"
          << "which is a full-path but not a valid library file name.";
      /* clang-format on */
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
    } break;
  }
}